

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O1

Mat_<double> *
MagnitudeSpectrogram
          (Mat_<double> *__return_storage_ptr__,Mat_<float> *emphasis_data,int n_fft,int hop_length,
          int win_length)

{
  double dVar1;
  char cVar2;
  int iVar3;
  ostream *this;
  long *plVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong local_448;
  AudioFFT fft;
  _OutputArray local_400;
  Mat_<float> feature_vector;
  Mat_<float> framef;
  Mat_<float> cv_feature;
  Mat_<float> Xrf;
  Mat_<float> cv_mag;
  Mat local_1f8 [96];
  Mat local_198 [144];
  Mat_<float> Xif;
  Mat_<float> cv_padbuffer;
  _InputArray local_48;
  
  if (win_length == 0) {
    win_length = n_fft;
  }
  iVar3 = win_length + 3;
  if (-1 < win_length) {
    iVar3 = win_length;
  }
  iVar3 = iVar3 >> 2;
  if (hop_length != 0) {
    iVar3 = hop_length;
  }
  iVar7 = n_fft / 2;
  cv::Mat::Mat(&cv_padbuffer.super_Mat);
  cv_padbuffer._0_4_ = cv_padbuffer._0_4_ & 0xfffff000 | 5;
  feature_vector._16_8_ = 0;
  feature_vector._0_4_ = 0x81010005;
  framef._16_8_ = 0;
  framef.super_Mat = (Mat)0x5;
  framef._1_3_ = 0x820100;
  cv_mag._16_8_ = 0;
  cv_mag._24_8_ = 0;
  cv_mag.super_Mat = (Mat)0x0;
  cv_mag._1_7_ = 0;
  cv_mag._8_8_ = 0;
  feature_vector._8_8_ = emphasis_data;
  framef._8_8_ = &cv_padbuffer.super_Mat;
  cv::copyMakeBorder((_InputArray *)&feature_vector,(_OutputArray *)&framef,0,0,iVar7,iVar7,4,
                     (Scalar_ *)&cv_mag);
  cVar2 = cv::Mat::empty();
  if (cVar2 != '\0') {
    cv::Mat::Mat(&cv_mag.super_Mat,1,n_fft,5);
    feature_vector._16_8_ = 0;
    feature_vector._24_8_ = 0;
    feature_vector.super_Mat = (Mat)0x0;
    feature_vector._1_7_ = 0;
    feature_vector._8_8_ = 0;
    cv::Mat::operator=(&cv_mag.super_Mat,(Scalar_ *)&feature_vector);
    cv::Mat::operator=(&hannWindow.super_Mat,&cv_mag.super_Mat);
    cv::Mat::~Mat(&cv_mag.super_Mat);
    if (n_fft - win_length == 0 || n_fft < win_length) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tn_fft:",7);
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,n_fft);
      std::__ostream_insert<char,std::char_traits<char>>(this," > win_length:",0xe);
      plVar4 = (long *)std::ostream::operator<<(this,n_fft);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      cv::Mat::Mat(&__return_storage_ptr__->super_Mat,0,0,6);
    }
    else if (0 < win_length) {
      iVar9 = (n_fft - win_length) / 2;
      uVar8 = 1;
      do {
        dVar1 = cos(((double)(int)uVar8 * (pi + pi)) / (double)(int)(win_length + 1U));
        *(float *)(hannWindow._16_8_ + (long)iVar9 * 4) = (float)((1.0 - dVar1) * 0.5);
        uVar8 = uVar8 + 1;
        iVar9 = iVar9 + 1;
      } while (win_length + 1U != uVar8);
    }
    if (n_fft <= win_length) goto LAB_0010500f;
  }
  uVar5 = cv_padbuffer._12_4_ * cv_padbuffer._8_4_ - n_fft;
  iVar7 = iVar7 + 1;
  cv::Mat::Mat(&feature_vector.super_Mat,(int)uVar5 / iVar3 + 1,iVar7,5);
  cv_mag._16_8_ = 0;
  cv_mag._24_8_ = 0;
  cv_mag.super_Mat = (Mat)0x0;
  cv_mag._1_7_ = 0;
  cv_mag._8_8_ = 0;
  cv::Mat::operator=(&feature_vector.super_Mat,(Scalar_ *)&cv_mag);
  fft._impl._M_t.
  super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
  .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl =
       (unique_ptr<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
        )operator_new(0x58);
  *(undefined ***)
   fft._impl._M_t.
   super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
   ._M_t.
   super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
   .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl =
       &PTR__OouraFFT_0010b940;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)fft._impl._M_t.
          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl + 0x50) = 0;
  audiofft::AudioFFT::init(&fft,(EVP_PKEY_CTX *)(long)n_fft);
  if (-1 < (int)uVar5) {
    lVar6 = 0;
    local_448 = 0;
    do {
      cv::Mat::Mat(&Xrf.super_Mat,1,n_fft,5,(void *)(cv_padbuffer._16_8_ + lVar6),0);
      cv::Mat::clone();
      cv::Mat::Mat(&framef.super_Mat);
      framef._0_4_ = framef._0_4_ & 0xfffff000 | 5;
      cv::Mat_<float>::operator=((Mat_<float> *)&framef.super_Mat,(Mat *)&cv_mag);
      cv::Mat::~Mat((Mat *)&cv_mag);
      cv::Mat::~Mat(&Xrf.super_Mat);
      Xrf._16_8_ = 0;
      Xrf.super_Mat = (Mat)0x5;
      Xrf._1_3_ = 0x810100;
      Xrf._8_8_ = &hannWindow;
      cv::Mat::mul((_InputArray *)&cv_mag,1.0);
      (**(code **)(*(long *)cv_mag._0_8_ + 0x18))
                (cv_mag._0_8_,(_InputArray *)&cv_mag,&framef.super_Mat,5);
      cv::Mat::~Mat(local_198);
      cv::Mat::~Mat(local_1f8);
      cv::Mat::~Mat((Mat *)&cv_mag.field_0x10);
      cv::Mat::Mat(&Xrf.super_Mat,1,iVar7,5);
      cv::Mat::Mat(&Xif.super_Mat,1,iVar7,5);
      (**(code **)(*(long *)fft._impl._M_t.
                            super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                            .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>.
                            _M_head_impl + 0x18))
                (fft._impl._M_t.
                 super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                 .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl,
                 framef._16_8_,Xrf._16_8_,Xif._16_8_);
      cv_mag._16_8_ = 0;
      cv_mag.super_Mat = (Mat)0x5;
      cv_mag._1_3_ = 0x810100;
      cv_feature._16_8_ = 0;
      cv_feature.super_Mat = (Mat)0x5;
      cv_feature._1_3_ = 0x820100;
      cv_feature._8_8_ = &Xrf.super_Mat;
      cv_mag._8_8_ = &Xrf.super_Mat;
      cv::pow((_InputArray *)&cv_mag,2.0,(_OutputArray *)&cv_feature.super_Mat);
      cv_mag._16_8_ = 0;
      cv_mag._0_4_ = 0x81010005;
      cv_feature._8_8_ = &Xif;
      cv_feature._16_8_ = 0;
      cv_feature.super_Mat = (Mat)0x5;
      cv_feature._1_3_ = 0x820100;
      cv_mag._8_8_ = cv_feature._8_8_;
      cv::pow((_InputArray *)&cv_mag,2.0,(_OutputArray *)&cv_feature.super_Mat);
      cv::Mat::Mat(&cv_feature.super_Mat,1,iVar7,5,
                   (void *)((long)(int)((long)((ulong)(uint)((int)local_448 >> 0x1f) << 0x20 |
                                              local_448 & 0xffffffff) / (long)iVar3) *
                            *(long *)feature_vector._72_8_ + feature_vector._16_8_),0);
      cv::operator+((Mat *)&cv_mag,&Xrf.super_Mat);
      cv::_InputArray::_InputArray(&local_48,(MatExpr *)&cv_mag);
      local_400.super__InputArray.sz.width = 0;
      local_400.super__InputArray.sz.height = 0;
      local_400.super__InputArray.flags = -0x7dfefffb;
      local_400.super__InputArray.obj = &cv_feature.super_Mat;
      cv::sqrt(&local_48,&local_400);
      cv::Mat::~Mat(local_198);
      cv::Mat::~Mat(local_1f8);
      cv::Mat::~Mat((Mat *)&cv_mag.field_0x10);
      cv::Mat::~Mat(&cv_feature.super_Mat);
      cv::Mat::~Mat(&Xif.super_Mat);
      cv::Mat::~Mat(&Xrf.super_Mat);
      cv::Mat::~Mat(&framef.super_Mat);
      local_448 = local_448 + (long)iVar3;
      lVar6 = lVar6 + (long)iVar3 * 4;
    } while ((long)local_448 <= (long)(ulong)uVar5);
  }
  cv::Mat::Mat((Mat *)&cv_mag);
  cv_mag._0_8_ = cv_mag._0_8_ & 0xfffffffffffff000 | 5;
  framef._16_8_ = 0;
  framef.super_Mat = (Mat)0x5;
  framef._1_3_ = 0x810100;
  framef._8_8_ = &feature_vector;
  Xrf._16_8_ = 0;
  Xrf.super_Mat = (Mat)0x5;
  Xrf._1_3_ = 0x820100;
  Xrf._8_8_ = (_InputArray *)&cv_mag;
  cv::transpose((_InputArray *)&framef,(_OutputArray *)&Xrf);
  cv::Mat::Mat(&__return_storage_ptr__->super_Mat);
  *(uint *)__return_storage_ptr__ = *(uint *)__return_storage_ptr__ & 0xfffff000 | 6;
  framef._16_8_ = 0;
  framef.super_Mat = (Mat)0x6;
  framef._1_3_ = 0x820100;
  framef._8_8_ = __return_storage_ptr__;
  cv::Mat::convertTo((_OutputArray *)&cv_mag,(int)&framef,1.0,0.0);
  cv::Mat::~Mat(&cv_mag.super_Mat);
  if (fft._impl._M_t.
      super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
      .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)fft._impl._M_t.
                          super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                          .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>.
                          _M_head_impl + 8))();
  }
  cv::Mat::~Mat(&feature_vector.super_Mat);
LAB_0010500f:
  cv::Mat::~Mat(&cv_padbuffer.super_Mat);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> MagnitudeSpectrogram(const cv::Mat_<float> *emphasis_data, int n_fft = 2048, int hop_length = 0,
                                      int win_length = 0) {
    if (win_length == 0) {
        win_length = n_fft;
    }
    if (hop_length == 0) {
        hop_length = win_length / 4;
    }

    // reflect对称填充
    int pad_lenght = n_fft / 2;
    // 使用opencv里的copyMakeBorder来完成reflect填充
    cv::Mat_<float> cv_padbuffer;
    cv::copyMakeBorder(*emphasis_data, cv_padbuffer, 0, 0, pad_lenght, pad_lenght, cv::BORDER_REFLECT_101);

    // windowing加窗：将每一帧乘以汉宁窗，以增加帧左端和右端的连续性。
    // 生成一个1600长度的hannWindow，并居中到2048长度的
    if (hannWindow.empty()) {
        hannWindow = cv::Mat_<float>(1, n_fft, 0.0f);
        int insert_cnt = 0;
        if (n_fft > win_length) {
            insert_cnt = (n_fft - win_length) / 2;
        } else {
            std::cout << "\tn_fft:" << n_fft << " > win_length:" << n_fft << std::endl;
            return cv::Mat_<double>(0, 0);
        }
        for (int k = 1; k <= win_length; k++) {
            hannWindow(0, k - 1 + insert_cnt) = float(0.5 * (1 - cos(2 * pi * k / (win_length + 1))));
        }
    }
    // opencv虽然有Hann窗生成函数，但是必须要求width > 1，height > 1
    //cv::Mat_<double> cv_hannWindow;
    //cv::createHanningWindow(cv_hannWindow, cv::Size(1, win_length), CV_64FC1);

    int size = cv_padbuffer.rows * cv_padbuffer.cols;//padbuffer.size()
    int number_feature_vectors = (size - n_fft) / hop_length + 1;
    int number_coefficients = n_fft / 2 + 1;
    cv::Mat_<float> feature_vector(number_feature_vectors, number_coefficients, 0.0f);

    audiofft::AudioFFT fft; //将FFT初始化放在循环外，可达到最优速度
    fft.init(size_t(n_fft));
    for (int i = 0; i <= size - n_fft; i += hop_length) {
        // 每次取一段数据
        cv::Mat_<float> framef = cv::Mat_<float>(1, n_fft, (float *) (cv_padbuffer.data) + i).clone();
        // 加hann窗
        framef = framef.mul(hannWindow);

        // 复数：Xrf实数，Xif虚数。
        cv::Mat_<float> Xrf(1, number_coefficients);
        cv::Mat_<float> Xif(1, number_coefficients);
        fft.fft((float *) (framef.data), (float *) (Xrf.data), (float *) (Xif.data));

        // 求模
        cv::pow(Xrf, 2, Xrf);
        cv::pow(Xif, 2, Xif);
        cv::Mat_<float> cv_feature(1, number_coefficients, &(feature_vector[i / hop_length][0]));
        cv::sqrt(Xrf + Xif, cv_feature);
    }
    cv::Mat_<float> cv_mag;
    cv::transpose(feature_vector, cv_mag);
    cv::Mat_<double> mag;
    cv_mag.convertTo(mag, CV_64FC1);

    return mag;
}